

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpContext.cpp
# Opt level: O2

ssize_t __thiscall higan::HttpContext::ParseHeader(HttpContext *this,char *begin,char *end)

{
  bool bVar1;
  char *end_00;
  char *begin_00;
  
  begin_00 = begin;
  do {
    end_00 = std::__search<char_const*,char_const*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                       (begin_00,end,CRLF,CRLF + CRLF_LEN);
    if (end_00 == end) {
LAB_001057f5:
      return (ssize_t)(end_00 + (CRLF_LEN - (long)begin));
    }
    if (begin_00 == end_00) {
      this->status_ = PARSE_ALL;
      goto LAB_001057f5;
    }
    bVar1 = HttpRequest::AddHeader(&this->request_,begin_00,end_00);
    if (!bVar1) {
      return -1;
    }
    begin_00 = end_00 + CRLF_LEN;
  } while( true );
}

Assistant:

ssize_t HttpContext::ParseHeader(const char* begin, const char* end)
{
	const char* line_begin = begin;
	const char* line_end = end;

	while ((line_end = std::search(line_begin, end, CRLF, CRLF + CRLF_LEN)) != end)
	{
		/**
		 * xxxx: xxxCRLFCRLF
		 * 搜索到两个连续的CRLF代表首部结束
		 */
		if (line_begin == line_end)
		{
			status_ = PARSE_ALL;
			break;
		}

		CHECK_IF_RETURN(request_.AddHeader(line_begin, line_end), false, -1);

		line_begin = line_end + CRLF_LEN;
	}

	return line_end + CRLF_LEN - begin;
}